

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

any __thiscall
cs_impl::
cni_helper<cs_impl::any_(*)(cs_impl::fiber::Channel<cs_impl::any>_&),_cs_impl::any_(*)(cs_impl::fiber::Channel<cs_impl::any>_&)>
::_call<0>(cni_helper<cs_impl::any_(*)(cs_impl::fiber::Channel<cs_impl::any>_&),_cs_impl::any_(*)(cs_impl::fiber::Channel<cs_impl::any>_&)>
           *this,vector *args,sequence<0> *param_3)

{
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RDX;
  any *in_RSI;
  Channel<cs_impl::any> *in_RDI;
  var *in_stack_000000e0;
  any *in_stack_ffffffffffffffb8;
  any in_stack_ffffffffffffffd8;
  
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](in_RDX,0);
  try_convert_and_check<cs_impl::fiber::Channel<cs_impl::any>_&,_cs_impl::fiber::Channel<cs_impl::any>_&,_cs_impl::fiber::Channel<cs_impl::any>,_0UL>
  ::convert(in_stack_000000e0);
  std::function<cs_impl::any_(cs_impl::fiber::Channel<cs_impl::any>_&)>::operator()
            ((function<cs_impl::any_(cs_impl::fiber::Channel<cs_impl::any>_&)> *)
             in_stack_ffffffffffffffd8.mDat,in_RDI);
  type_convertor<cs_impl::any,_cs_impl::any>::convert<cs_impl::any>((any *)&stack0xffffffffffffffd8)
  ;
  any::any(in_RSI,in_stack_ffffffffffffffb8);
  any::~any((any *)0x4c3df8);
  return (any)(proxy *)in_RDI;
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}